

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::RelaxFloatOpsPass::Initialize(RelaxFloatOpsPass *this)

{
  initializer_list<spv::Op> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<spv::Op> __l_01;
  initializer_list<spv::Op> __l_02;
  Op local_21c [25];
  iterator local_1b8;
  undefined8 local_1b0;
  uint local_1a8 [50];
  iterator local_e0;
  undefined8 local_d8;
  Op local_d0 [12];
  iterator local_a0;
  undefined8 local_98;
  Op local_8c [27];
  iterator local_20;
  undefined8 local_18;
  RelaxFloatOpsPass *local_10;
  RelaxFloatOpsPass *this_local;
  
  local_10 = this;
  memcpy(local_8c,&DAT_00cd56d0,0x6c);
  local_20 = local_8c;
  local_18 = 0x1b;
  __l_02._M_len = 0x1b;
  __l_02._M_array = local_20;
  std::
  unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::operator=(&this->target_ops_core_f_rslt_,__l_02);
  memcpy(local_d0,&DAT_00cd573c,0x30);
  local_a0 = local_d0;
  local_98 = 0xc;
  __l_01._M_len = 0xc;
  __l_01._M_array = local_a0;
  std::
  unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::operator=(&this->target_ops_core_f_opnd_,__l_01);
  memcpy(local_1a8,&DAT_00cd576c,200);
  local_e0 = local_1a8;
  local_d8 = 0x32;
  __l_00._M_len = 0x32;
  __l_00._M_array = local_e0;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::operator=((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&this->target_ops_450_,__l_00);
  memcpy(local_21c,&DAT_00cd5834,100);
  local_1b8 = local_21c;
  local_1b0 = 0x19;
  __l._M_len = 0x19;
  __l._M_array = local_1b8;
  std::
  unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
  ::operator=(&this->sample_ops_,__l);
  return;
}

Assistant:

void RelaxFloatOpsPass::Initialize() {
  target_ops_core_f_rslt_ = {
      spv::Op::OpLoad,
      spv::Op::OpPhi,
      spv::Op::OpVectorExtractDynamic,
      spv::Op::OpVectorInsertDynamic,
      spv::Op::OpVectorShuffle,
      spv::Op::OpCompositeExtract,
      spv::Op::OpCompositeConstruct,
      spv::Op::OpCompositeInsert,
      spv::Op::OpCopyObject,
      spv::Op::OpTranspose,
      spv::Op::OpConvertSToF,
      spv::Op::OpConvertUToF,
      spv::Op::OpFConvert,
      // spv::Op::OpQuantizeToF16,
      spv::Op::OpFNegate,
      spv::Op::OpFAdd,
      spv::Op::OpFSub,
      spv::Op::OpFMul,
      spv::Op::OpFDiv,
      spv::Op::OpFMod,
      spv::Op::OpVectorTimesScalar,
      spv::Op::OpMatrixTimesScalar,
      spv::Op::OpVectorTimesMatrix,
      spv::Op::OpMatrixTimesVector,
      spv::Op::OpMatrixTimesMatrix,
      spv::Op::OpOuterProduct,
      spv::Op::OpDot,
      spv::Op::OpSelect,
  };
  target_ops_core_f_opnd_ = {
      spv::Op::OpFOrdEqual,
      spv::Op::OpFUnordEqual,
      spv::Op::OpFOrdNotEqual,
      spv::Op::OpFUnordNotEqual,
      spv::Op::OpFOrdLessThan,
      spv::Op::OpFUnordLessThan,
      spv::Op::OpFOrdGreaterThan,
      spv::Op::OpFUnordGreaterThan,
      spv::Op::OpFOrdLessThanEqual,
      spv::Op::OpFUnordLessThanEqual,
      spv::Op::OpFOrdGreaterThanEqual,
      spv::Op::OpFUnordGreaterThanEqual,
  };
  target_ops_450_ = {
      GLSLstd450Round, GLSLstd450RoundEven, GLSLstd450Trunc, GLSLstd450FAbs,
      GLSLstd450FSign, GLSLstd450Floor, GLSLstd450Ceil, GLSLstd450Fract,
      GLSLstd450Radians, GLSLstd450Degrees, GLSLstd450Sin, GLSLstd450Cos,
      GLSLstd450Tan, GLSLstd450Asin, GLSLstd450Acos, GLSLstd450Atan,
      GLSLstd450Sinh, GLSLstd450Cosh, GLSLstd450Tanh, GLSLstd450Asinh,
      GLSLstd450Acosh, GLSLstd450Atanh, GLSLstd450Atan2, GLSLstd450Pow,
      GLSLstd450Exp, GLSLstd450Log, GLSLstd450Exp2, GLSLstd450Log2,
      GLSLstd450Sqrt, GLSLstd450InverseSqrt, GLSLstd450Determinant,
      GLSLstd450MatrixInverse,
      // TODO(greg-lunarg): GLSLstd450ModfStruct,
      GLSLstd450FMin, GLSLstd450FMax, GLSLstd450FClamp, GLSLstd450FMix,
      GLSLstd450Step, GLSLstd450SmoothStep, GLSLstd450Fma,
      // TODO(greg-lunarg): GLSLstd450FrexpStruct,
      GLSLstd450Ldexp, GLSLstd450Length, GLSLstd450Distance, GLSLstd450Cross,
      GLSLstd450Normalize, GLSLstd450FaceForward, GLSLstd450Reflect,
      GLSLstd450Refract, GLSLstd450NMin, GLSLstd450NMax, GLSLstd450NClamp};
  sample_ops_ = {spv::Op::OpImageSampleImplicitLod,
                 spv::Op::OpImageSampleExplicitLod,
                 spv::Op::OpImageSampleDrefImplicitLod,
                 spv::Op::OpImageSampleDrefExplicitLod,
                 spv::Op::OpImageSampleProjImplicitLod,
                 spv::Op::OpImageSampleProjExplicitLod,
                 spv::Op::OpImageSampleProjDrefImplicitLod,
                 spv::Op::OpImageSampleProjDrefExplicitLod,
                 spv::Op::OpImageFetch,
                 spv::Op::OpImageGather,
                 spv::Op::OpImageDrefGather,
                 spv::Op::OpImageRead,
                 spv::Op::OpImageSparseSampleImplicitLod,
                 spv::Op::OpImageSparseSampleExplicitLod,
                 spv::Op::OpImageSparseSampleDrefImplicitLod,
                 spv::Op::OpImageSparseSampleDrefExplicitLod,
                 spv::Op::OpImageSparseSampleProjImplicitLod,
                 spv::Op::OpImageSparseSampleProjExplicitLod,
                 spv::Op::OpImageSparseSampleProjDrefImplicitLod,
                 spv::Op::OpImageSparseSampleProjDrefExplicitLod,
                 spv::Op::OpImageSparseFetch,
                 spv::Op::OpImageSparseGather,
                 spv::Op::OpImageSparseDrefGather,
                 spv::Op::OpImageSparseTexelsResident,
                 spv::Op::OpImageSparseRead};
}